

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::update(Shape *this)

{
  float fVar1;
  float fVar2;
  Vector2f VVar3;
  Color CVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  Vertex *pVVar8;
  Vertex *pVVar9;
  size_t sVar10;
  long *in_RDI;
  FloatRect FVar11;
  Shape *in_stack_00000030;
  size_t i;
  size_t count;
  Vertex *in_stack_ffffffffffffff68;
  VertexArray *in_stack_ffffffffffffff70;
  VertexArray *this_00;
  Shape *in_stack_ffffffffffffff80;
  Shape *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffb0;
  VertexBuffer *in_stack_ffffffffffffffb8;
  VertexBuffer *this_01;
  ulong local_18;
  
  uVar6 = (**(code **)(*in_RDI + 0x18))();
  if (uVar6 < 3) {
    VertexArray::resize(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    VertexArray::resize(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    bVar5 = VertexBuffer::isAvailable();
    if (bVar5) {
      sVar7 = VertexBuffer::getVertexCount((VertexBuffer *)(in_RDI + 0x26));
      if (sVar7 != 0) {
        VertexBuffer::create(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      sVar7 = VertexBuffer::getVertexCount((VertexBuffer *)(in_RDI + 0x2a));
      if (sVar7 != 0) {
        VertexBuffer::create(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
    }
  }
  else {
    VertexArray::resize(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    for (local_18 = 0; local_18 < uVar6; local_18 = local_18 + 1) {
      VVar3 = (Vector2f)(**(code **)(*in_RDI + 0x20))(in_RDI,local_18);
      pVVar8 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      pVVar8->position = VVar3;
    }
    this_01 = (VertexBuffer *)(in_RDI + 0x1c);
    pVVar8 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    pVVar9 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    pVVar9->position = pVVar8->position;
    pVVar8 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    pVVar9 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    (pVVar9->texCoords).y = (pVVar8->texCoords).y;
    CVar4 = pVVar8->color;
    fVar1 = (pVVar8->texCoords).x;
    pVVar9->position = pVVar8->position;
    pVVar9->color = CVar4;
    (pVVar9->texCoords).x = fVar1;
    FVar11 = VertexArray::getBounds((VertexArray *)in_stack_ffffffffffffff90);
    in_RDI[0x2e] = FVar11._0_8_;
    in_RDI[0x2f] = FVar11._8_8_;
    fVar1 = *(float *)(in_RDI + 0x2e);
    fVar2 = *(float *)(in_RDI + 0x2f);
    pVVar9 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    (pVVar9->position).x = fVar1 + fVar2 / 2.0;
    fVar1 = *(float *)((long)in_RDI + 0x174);
    fVar2 = *(float *)((long)in_RDI + 0x17c);
    pVVar9 = VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    (pVVar9->position).y = fVar1 + fVar2 / 2.0;
    updateFillColors(in_stack_ffffffffffffff80);
    updateTexCoords(in_stack_ffffffffffffff90);
    updateOutline(in_stack_00000030);
    bVar5 = VertexBuffer::isAvailable();
    if (bVar5) {
      sVar7 = VertexBuffer::getVertexCount((VertexBuffer *)(in_RDI + 0x26));
      sVar10 = VertexArray::getVertexCount((VertexArray *)0x16a013);
      if (sVar7 != sVar10) {
        VertexArray::getVertexCount((VertexArray *)0x16a03f);
        VertexBuffer::create(this_01,(size_t)pVVar8);
      }
      VertexArray::operator[](in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      VertexBuffer::update((VertexBuffer *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      sVar7 = VertexBuffer::getVertexCount((VertexBuffer *)(in_RDI + 0x2a));
      sVar10 = VertexArray::getVertexCount((VertexArray *)0x16a0a3);
      if (sVar7 != sVar10) {
        VertexArray::getVertexCount((VertexArray *)0x16a0cf);
        VertexBuffer::create(this_01,(size_t)pVVar8);
      }
      sVar7 = VertexArray::getVertexCount((VertexArray *)0x16a0ed);
      if (sVar7 != 0) {
        this_00 = (VertexArray *)(in_RDI + 0x2a);
        VertexArray::operator[](this_00,(size_t)in_stack_ffffffffffffff68);
        VertexBuffer::update((VertexBuffer *)this_00,in_stack_ffffffffffffff68);
      }
    }
  }
  return;
}

Assistant:

void Shape::update()
{
    // Get the total number of points of the shape
    std::size_t count = getPointCount();
    if (count < 3)
    {
        m_vertices.resize(0);
        m_outlineVertices.resize(0);

        if (VertexBuffer::isAvailable())
        {
            if (m_verticesBuffer.getVertexCount())
                m_verticesBuffer.create(0);

            if (m_outlineVerticesBuffer.getVertexCount())
                m_outlineVerticesBuffer.create(0);
        }

        return;
    }

    m_vertices.resize(count + 2); // + 2 for center and repeated first point

    // Position
    for (std::size_t i = 0; i < count; ++i)
        m_vertices[i + 1].position = getPoint(i);
    m_vertices[count + 1].position = m_vertices[1].position;

    // Update the bounding rectangle
    m_vertices[0] = m_vertices[1]; // so that the result of getBounds() is correct
    m_insideBounds = m_vertices.getBounds();

    // Compute the center and make it the first vertex
    m_vertices[0].position.x = m_insideBounds.left + m_insideBounds.width / 2;
    m_vertices[0].position.y = m_insideBounds.top + m_insideBounds.height / 2;

    // Color
    updateFillColors();

    // Texture coordinates
    updateTexCoords();

    // Outline
    updateOutline();

    // Update the vertex buffers if they are being used
    if (VertexBuffer::isAvailable())
    {
        if (m_verticesBuffer.getVertexCount() != m_vertices.getVertexCount())
            m_verticesBuffer.create(m_vertices.getVertexCount());

        m_verticesBuffer.update(&m_vertices[0]);

        if (m_outlineVerticesBuffer.getVertexCount() != m_outlineVertices.getVertexCount())
            m_outlineVerticesBuffer.create(m_outlineVertices.getVertexCount());

        if (m_outlineVertices.getVertexCount())
            m_outlineVerticesBuffer.update(&m_outlineVertices[0]);
    }
}